

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O3

Maybe<capnp::MessageReaderAndFds> * __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
::anon_class_32_2_fe89d4e7_for_func::operator()
          (Maybe<capnp::MessageReaderAndFds> *__return_storage_ptr__,
          anon_class_32_2_fe89d4e7_for_func *this,Maybe<unsigned_long> *nfds)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar1;
  OwnFd *pOVar2;
  AsyncMessageReader *pAVar3;
  bool bVar4;
  
  bVar4 = (nfds->ptr).isSet == true;
  if (bVar4) {
    aVar1 = (nfds->ptr).field_1;
    pOVar2 = (this->fdSpace).ptr;
    pAVar3 = (this->reader).ptr;
    (this->reader).ptr = (AsyncMessageReader *)0x0;
    (__return_storage_ptr__->ptr).field_1.value.reader.disposer = (this->reader).disposer;
    (__return_storage_ptr__->ptr).field_1.value.reader.ptr = &pAVar3->super_MessageReader;
    (__return_storage_ptr__->ptr).field_1.value.fds.ptr = pOVar2;
    (__return_storage_ptr__->ptr).field_1.value.fds.size_ = (size_t)aVar1;
  }
  (__return_storage_ptr__->ptr).isSet = bVar4;
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_SOME(n, nfds) {
      return MessageReaderAndFds { kj::mv(reader), fdSpace.first(n) };
    }